

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qconcatenatetablesproxymodel.cpp
# Opt level: O0

QModelIndex * __thiscall
QConcatenateTablesProxyModel::mapFromSource
          (QConcatenateTablesProxyModel *this,QModelIndex *sourceIndex)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QConcatenateTablesProxyModelPrivate *pQVar4;
  QConcatenateTablesProxyModelPrivate *this_00;
  QModelIndex *in_RDX;
  QConcatenateTablesProxyModelPrivate *in_RDI;
  long in_FS_OFFSET;
  int rowsPrior;
  QAbstractItemModel *sourceModel;
  QConcatenateTablesProxyModelPrivate *d;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  QConcatenateTablesProxyModelPrivate *this_01;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  pQVar4 = d_func((QConcatenateTablesProxyModel *)0x856ed9);
  bVar1 = QModelIndex::isValid
                    ((QModelIndex *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  if (bVar1) {
    this_00 = (QConcatenateTablesProxyModelPrivate *)QModelIndex::model((QModelIndex *)0x856f05);
    bVar1 = QConcatenateTablesProxyModelPrivate::containsSourceModel
                      (this_01,(QAbstractItemModel *)in_RDI);
    if (bVar1) {
      iVar2 = QModelIndex::column(in_RDX);
      if (iVar2 < pQVar4->m_columnCount) {
        d_func((QConcatenateTablesProxyModel *)0x856f7f);
        iVar3 = QConcatenateTablesProxyModelPrivate::computeRowsPrior
                          (this_00,(QAbstractItemModel *)
                                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
        iVar2 = QModelIndex::row(in_RDX);
        iVar3 = iVar3 + iVar2;
        iVar2 = QModelIndex::column(in_RDX);
        QModelIndex::internalPointer(in_RDX);
        QAbstractItemModel::createIndex
                  ((QAbstractItemModel *)this_01,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                   (void *)CONCAT44(iVar2,iVar3));
      }
      else {
        QModelIndex::QModelIndex((QModelIndex *)0x856f73);
      }
    }
    else {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)this_01,(char *)in_RDI,in_stack_ffffffffffffff94,
                 (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      QMessageLogger::warning
                (&local_28,
                 "QConcatenateTablesProxyModel: index from wrong model passed to mapFromSource");
      QModelIndex::QModelIndex((QModelIndex *)0x856f4d);
    }
  }
  else {
    QModelIndex::QModelIndex((QModelIndex *)0x856ef6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QModelIndex *)this_01;
  }
  __stack_chk_fail();
}

Assistant:

QModelIndex QConcatenateTablesProxyModel::mapFromSource(const QModelIndex &sourceIndex) const
{
    Q_D(const QConcatenateTablesProxyModel);
    if (!sourceIndex.isValid())
        return QModelIndex();
    const QAbstractItemModel *sourceModel = sourceIndex.model();
    if (!d->containsSourceModel(sourceModel)) {
        qWarning("QConcatenateTablesProxyModel: index from wrong model passed to mapFromSource");
        Q_ASSERT(!"QConcatenateTablesProxyModel: index from wrong model passed to mapFromSource");
        return QModelIndex();
    }
    if (sourceIndex.column() >= d->m_columnCount)
        return QModelIndex();
    int rowsPrior = d_func()->computeRowsPrior(sourceModel);
    return createIndex(rowsPrior + sourceIndex.row(), sourceIndex.column(), sourceIndex.internalPointer());
}